

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall ccs::ParserImpl::advance(ParserImpl *this)

{
  uint32_t uVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Type TVar6;
  uint32_t uVar7;
  long *local_f0 [2];
  long local_e0 [2];
  vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> local_d0;
  int64_t local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> local_78;
  int64_t local_60;
  double dStack_58;
  vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> local_48;
  
  (this->last_).location.column = (this->cur_).location.column;
  uVar1 = (this->cur_).location.line;
  (this->last_).type = (this->cur_).type;
  (this->last_).location.line = uVar1;
  std::__cxx11::string::_M_assign((string *)&(this->last_).value);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::operator=
            (&(this->last_).stringValue.elements_,&(this->cur_).stringValue.elements_);
  uVar3 = *(undefined4 *)((long)&(this->cur_).intValue + 4);
  uVar4 = *(undefined4 *)&(this->cur_).doubleValue;
  uVar5 = *(undefined4 *)((long)&(this->cur_).doubleValue + 4);
  *(int *)&(this->last_).intValue = (int)(this->cur_).intValue;
  *(undefined4 *)((long)&(this->last_).intValue + 4) = uVar3;
  *(undefined4 *)&(this->last_).doubleValue = uVar4;
  *(undefined4 *)((long)&(this->last_).doubleValue + 4) = uVar5;
  uVar1 = (this->lex_).next_.location.column;
  TVar6 = (this->lex_).next_.type;
  uVar7 = (this->lex_).next_.location.line;
  local_f0[0] = local_e0;
  pcVar2 = (this->lex_).next_.value._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar2,pcVar2 + (this->lex_).next_.value._M_string_length);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::vector
            (&local_d0,&(this->lex_).next_.stringValue.elements_);
  local_b8 = (this->lex_).next_.intValue;
  dStack_b0 = (this->lex_).next_.doubleValue;
  anon_unknown_0::Lexer::nextToken((Token *)local_a8,&this->lex_);
  (this->lex_).next_.location.column = local_a8._8_4_;
  (this->lex_).next_.type = local_a8._0_4_;
  (this->lex_).next_.location.line = local_a8._4_4_;
  std::__cxx11::string::operator=((string *)&(this->lex_).next_.value,(string *)&local_98);
  local_48.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_start =
       (this->lex_).next_.stringValue.elements_.
       super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(this->lex_).next_.stringValue.elements_.
                super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
                super__Vector_impl_data + 8);
  local_48.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(this->lex_).next_.stringValue.elements_.
                super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
                super__Vector_impl_data + 0x10);
  (this->lex_).next_.stringValue.elements_.
  super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->lex_).next_.stringValue.elements_.
           super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->lex_).next_.stringValue.elements_.
           super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector(&local_48);
  (this->lex_).next_.intValue = local_60;
  (this->lex_).next_.doubleValue = dStack_58;
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector(&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  (this->cur_).location.column = uVar1;
  (this->cur_).type = TVar6;
  (this->cur_).location.line = uVar7;
  std::__cxx11::string::operator=((string *)&(this->cur_).value,(string *)local_f0);
  local_a8._0_8_ =
       (this->cur_).stringValue.elements_.
       super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_a8._8_8_ =
       (this->cur_).stringValue.elements_.
       super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98._M_p =
       (pointer)(this->cur_).stringValue.elements_.
                super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  (this->cur_).stringValue.elements_.
  super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->cur_).stringValue.elements_.
  super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->cur_).stringValue.elements_.
  super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector
            ((vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> *)local_a8);
  (this->cur_).intValue = local_b8;
  (this->cur_).doubleValue = dStack_b0;
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector(&local_d0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void advance() { last_ = cur_; cur_ = lex_.consume(); }